

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryMLT.hpp
# Opt level: O1

int __thiscall
ddd::DictionaryMLT<false,_false>::stat(DictionaryMLT<false,_false> *this,char *__file,stat *__buf)

{
  uint uVar1;
  DaTrie<false,_false,_true> *pDVar2;
  pointer pBVar3;
  pointer pcVar4;
  pointer puVar5;
  __uniq_ptr_impl<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
  _Var6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  pointer pBVar11;
  pointer pcVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  undefined1 auVar18 [16];
  ulong uVar19;
  long lVar20;
  long lVar21;
  long lVar22;
  undefined1 auVar23 [16];
  long lVar24;
  long lVar25;
  long lVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  
  *(size_t *)__file = this->num_keys_;
  __file[8] = '\x01';
  __file[9] = '\0';
  __file[10] = '\0';
  __file[0xb] = '\0';
  __file[0xc] = '\0';
  __file[0xd] = '\0';
  __file[0xe] = '\0';
  __file[0xf] = '\0';
  pDVar2 = (this->prefix_subtrie_)._M_t.
           super___uniq_ptr_impl<ddd::DaTrie<false,_false,_true>,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_true>_*,_std::default_delete<ddd::DaTrie<false,_false,_true>_>_>
           .super__Head_base<0UL,_ddd::DaTrie<false,_false,_true>_*,_false>._M_head_impl;
  uVar1 = pDVar2->bc_emps_;
  pBVar11 = *(pointer *)
             ((long)&(pDVar2->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_> + 0x10);
  lVar13 = *(long *)&(pDVar2->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>;
  pBVar3 = *(pointer *)
            ((long)&(pDVar2->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_> + 8);
  auVar18._8_4_ = (int)lVar13;
  auVar18._0_8_ = lVar13;
  auVar18._12_4_ = (int)((ulong)lVar13 >> 0x20);
  uVar19 = (ulong)((long)*(pointer *)
                          ((long)&(pDVar2->bc_).
                                  super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_> + 8) -
                  lVar13) >> 3;
  *(ulong *)(__file + 0x10) = (ulong)((int)uVar19 - uVar1);
  *(ulong *)(__file + 0x18) = uVar19 & 0xffffffff;
  *(ulong *)(__file + 0x20) = (ulong)((long)pBVar11 - auVar18._8_8_) >> 3 & 0xffffffff;
  *(ulong *)(__file + 0x28) = (ulong)uVar1;
  lVar14 = *(long *)&(pDVar2->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl;
  pcVar12 = *(pointer *)
             ((long)&(pDVar2->tail_).super__Vector_base<char,_std::allocator<char>_> + 0x10);
  auVar23._8_4_ = (int)lVar14;
  auVar23._0_8_ = lVar14;
  auVar23._12_4_ = (int)((ulong)lVar14 >> 0x20);
  pcVar4 = *(pointer *)((long)&(pDVar2->tail_).super__Vector_base<char,_std::allocator<char>_> + 8);
  *(ulong *)(__file + 0x30) =
       (long)*(pointer *)
              ((long)&(pDVar2->tail_).super__Vector_base<char,_std::allocator<char>_> + 8) - lVar14
       & 0xffffffff;
  *(ulong *)(__file + 0x38) = (long)pcVar12 - auVar23._8_8_ & 0xffffffff;
  *(ulong *)(__file + 0x40) = (ulong)pDVar2->tail_emps_;
  *(pointer *)(__file + 0x48) =
       pcVar4 + (long)&pBVar3->field_0x0 +
       (long)*(pointer *)
              ((long)&(pDVar2->blocks_).super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>
              + 8) +
       (long)*(pointer *)
              ((long)&(pDVar2->node_links_).
                      super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_> + 8) +
       (0x2c - (lVar13 + lVar14 +
                *(long *)&(pDVar2->blocks_).
                          super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>._M_impl +
               *(long *)&(pDVar2->node_links_).
                         super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>._M_impl))
  ;
  puVar5 = (this->suffix_subtries_).
           super__Vector_base<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar13 = (long)(this->suffix_subtries_).
                 super__Vector_base<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>,_std::allocator<std::unique_ptr<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)puVar5;
  if (lVar13 != 0) {
    lVar14 = *(long *)(__file + 0x48);
    lVar15 = *(long *)(__file + 0x40);
    lVar20 = *(long *)(__file + 0x30);
    lVar21 = *(long *)(__file + 0x38);
    lVar16 = *(long *)(__file + 0x28);
    lVar22 = *(long *)(__file + 8);
    lVar24 = *(long *)(__file + 0x10);
    lVar25 = *(long *)(__file + 0x18);
    lVar26 = *(long *)(__file + 0x20);
    lVar13 = lVar13 >> 3;
    lVar17 = 0;
    do {
      _Var6._M_t.
      super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
      .super__Head_base<0UL,_ddd::DaTrie<false,_false,_false>_*,_false>._M_head_impl =
           puVar5[lVar17]._M_t.
           super___uniq_ptr_impl<ddd::DaTrie<false,_false,_false>,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
           ._M_t;
      if ((_Tuple_impl<0UL,_ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
           )_Var6._M_t.
            super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
            .super__Head_base<0UL,_ddd::DaTrie<false,_false,_false>_*,_false>._M_head_impl !=
          (DaTrie<false,_false,_false> *)0x0) {
        uVar1 = *(uint *)((long)_Var6._M_t.
                                super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
                                .super__Head_base<0UL,_ddd::DaTrie<false,_false,_false>_*,_false>.
                                _M_head_impl + 100);
        lVar7 = *(long *)_Var6._M_t.
                         super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
                         .super__Head_base<0UL,_ddd::DaTrie<false,_false,_false>_*,_false>.
                         _M_head_impl;
        lVar8 = *(long *)((long)_Var6._M_t.
                                super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
                                .super__Head_base<0UL,_ddd::DaTrie<false,_false,_false>_*,_false>.
                                _M_head_impl + 8);
        auVar27._8_4_ = (int)lVar7;
        auVar27._0_8_ = lVar7;
        auVar27._12_4_ = (int)((ulong)lVar7 >> 0x20);
        uVar19 = (ulong)(*(long *)((long)_Var6._M_t.
                                         super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
                                         .
                                         super__Head_base<0UL,_ddd::DaTrie<false,_false,_false>_*,_false>
                                         ._M_head_impl + 8) - lVar7) >> 3;
        lVar25 = lVar25 + (uVar19 & 0xffffffff);
        lVar26 = lVar26 + ((ulong)(*(long *)((long)_Var6._M_t.
                                                                                                      
                                                  super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
                                                  .
                                                  super__Head_base<0UL,_ddd::DaTrie<false,_false,_false>_*,_false>
                                                  ._M_head_impl + 0x10) - auVar27._8_8_) >> 3 &
                          0xffffffff);
        *(long *)(__file + 0x18) = lVar25;
        *(long *)(__file + 0x20) = lVar26;
        lVar16 = lVar16 + (ulong)uVar1;
        *(long *)(__file + 0x28) = lVar16;
        lVar9 = *(long *)((long)_Var6._M_t.
                                super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
                                .super__Head_base<0UL,_ddd::DaTrie<false,_false,_false>_*,_false>.
                                _M_head_impl + 0x18);
        auVar28._8_4_ = (int)lVar9;
        auVar28._0_8_ = lVar9;
        auVar28._12_4_ = (int)((ulong)lVar9 >> 0x20);
        lVar20 = lVar20 + (*(long *)((long)_Var6._M_t.
                                           super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
                                           .
                                           super__Head_base<0UL,_ddd::DaTrie<false,_false,_false>_*,_false>
                                           ._M_head_impl + 0x20) - lVar9 & 0xffffffffU);
        lVar21 = lVar21 + (*(long *)((long)_Var6._M_t.
                                           super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
                                           .
                                           super__Head_base<0UL,_ddd::DaTrie<false,_false,_false>_*,_false>
                                           ._M_head_impl + 0x28) - auVar28._8_8_ & 0xffffffffU);
        lVar10 = *(long *)((long)_Var6._M_t.
                                 super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
                                 .super__Head_base<0UL,_ddd::DaTrie<false,_false,_false>_*,_false>.
                                 _M_head_impl + 0x20);
        *(long *)(__file + 0x30) = lVar20;
        *(long *)(__file + 0x38) = lVar21;
        lVar15 = lVar15 + (ulong)*(uint *)((long)_Var6._M_t.
                                                 super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
                                                 .
                                                 super__Head_base<0UL,_ddd::DaTrie<false,_false,_false>_*,_false>
                                                 ._M_head_impl + 0x68);
        *(long *)(__file + 0x40) = lVar15;
        lVar14 = lVar14 + ((lVar8 + lVar10 +
                            *(long *)((long)_Var6._M_t.
                                            super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
                                            .
                                            super__Head_base<0UL,_ddd::DaTrie<false,_false,_false>_*,_false>
                                            ._M_head_impl + 0x38) +
                           *(long *)((long)_Var6._M_t.
                                           super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
                                           .
                                           super__Head_base<0UL,_ddd::DaTrie<false,_false,_false>_*,_false>
                                           ._M_head_impl + 0x50)) -
                          (lVar7 + lVar9 +
                           *(long *)((long)_Var6._M_t.
                                           super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
                                           .
                                           super__Head_base<0UL,_ddd::DaTrie<false,_false,_false>_*,_false>
                                           ._M_head_impl + 0x30) +
                          *(long *)((long)_Var6._M_t.
                                          super__Tuple_impl<0UL,_ddd::DaTrie<false,_false,_false>_*,_std::default_delete<ddd::DaTrie<false,_false,_false>_>_>
                                          .
                                          super__Head_base<0UL,_ddd::DaTrie<false,_false,_false>_*,_false>
                                          ._M_head_impl + 0x48))) + 0x2c;
        lVar22 = lVar22 + 1;
        lVar24 = lVar24 + (ulong)((int)uVar19 - uVar1);
        *(long *)(__file + 8) = lVar22;
        *(long *)(__file + 0x10) = lVar24;
      }
      lVar14 = lVar14 + 1;
      lVar17 = lVar17 + 1;
    } while (lVar13 + (ulong)(lVar13 == 0) != lVar17);
    *(long *)(__file + 0x48) = lVar14;
  }
  *(long *)(__file + 0x48) = *(long *)(__file + 0x48) + 0x14;
  return (int)puVar5;
}

Assistant:

void stat(Stat& ret) const {
    ret.num_keys = num_keys_;
    ret.num_tries = 1;
    ret.num_nodes = prefix_subtrie_->num_nodes();
    ret.bc_size = prefix_subtrie_->bc_size();
    ret.bc_capa = prefix_subtrie_->bc_capa();
    ret.bc_emps = prefix_subtrie_->bc_emps();
    ret.tail_size = prefix_subtrie_->tail_size();
    ret.tail_capa = prefix_subtrie_->tail_capa();
    ret.tail_emps = prefix_subtrie_->tail_emps();
    ret.size_in_bytes = prefix_subtrie_->size_in_bytes();

    for (size_t i = 0; i < suffix_subtries_.size(); ++i) {
      auto& subtrie = suffix_subtries_[i];
      if (subtrie) {
        ret.num_nodes += subtrie->num_nodes();
        ret.bc_size += subtrie->bc_size();
        ret.bc_capa += subtrie->bc_capa();
        ret.bc_emps += subtrie->bc_emps();
        ret.tail_size += subtrie->tail_size();
        ret.tail_capa += subtrie->tail_capa();
        ret.tail_emps += subtrie->tail_emps();
        ret.size_in_bytes += subtrie->size_in_bytes();
        ++ret.num_tries;
      }
      ret.size_in_bytes += sizeof(bool);
    }

    ret.size_in_bytes += sizeof(suffix_subtries_.size());
    ret.size_in_bytes += sizeof(suffix_head_);
    ret.size_in_bytes += sizeof(num_keys_);
  }